

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O0

void __thiscall
Minisat::OnlineProofChecker::addParsedclause(OnlineProofChecker *this,vec<Minisat::Lit> *cls)

{
  int iVar1;
  int iVar2;
  Lit *pLVar3;
  vec<Minisat::Lit> *this_00;
  ostream *this_01;
  vec<Minisat::Lit> *in_RSI;
  ClauseAllocator *in_RDI;
  CRef in_stack_0000000c;
  OnlineProofChecker *in_stack_00000010;
  int i_1;
  CRef ref;
  int i;
  Lit *in_stack_ffffffffffffffa8;
  vec<unsigned_int> *in_stack_ffffffffffffffb0;
  vec<Minisat::Lit> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int local_20;
  int local_14;
  
  iVar1 = vec<Minisat::Lit>::size(in_RSI);
  if (iVar1 == 0) {
    *in_RDI = (ClauseAllocator)0x0;
  }
  else {
    local_14 = 0;
    while (iVar1 = local_14, iVar2 = vec<Minisat::Lit>::size(in_RSI), iVar1 < iVar2) {
      while( true ) {
        in_stack_ffffffffffffffc8 = nVars((OnlineProofChecker *)0x111174);
        pLVar3 = vec<Minisat::Lit>::operator[](in_RSI,local_14);
        iVar1 = var((Lit)pLVar3->x);
        if (iVar1 < in_stack_ffffffffffffffc8) break;
        newVar(this);
      }
      local_14 = local_14 + 1;
    }
    iVar2 = vec<Minisat::Lit>::size(in_RSI);
    if (iVar2 < 2) {
      this_00 = (vec<Minisat::Lit> *)(in_RDI + 0x30);
      vec<Minisat::Lit>::operator[](in_RSI,0);
      vec<Minisat::Lit>::push(this_00,in_stack_ffffffffffffffa8);
    }
    else {
      ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>
                (in_RDI,(vec<Minisat::Lit> *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                 SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
      local_20 = 0;
      while (in_stack_ffffffffffffffc4 = local_20, iVar1 = vec<Minisat::Lit>::size(in_RSI),
            in_stack_ffffffffffffffc4 < iVar1) {
        in_stack_ffffffffffffffb8 = (vec<Minisat::Lit> *)(in_RDI + 0x40);
        pLVar3 = vec<Minisat::Lit>::operator[](in_RSI,local_20);
        iVar1 = toInt((Lit)pLVar3->x);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)in_stack_ffffffffffffffb8,(long)iVar1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (value_type_conflict1 *)in_stack_ffffffffffffffb8);
        local_20 = local_20 + 1;
      }
      attachClause(in_stack_00000010,in_stack_0000000c);
      vec<unsigned_int>::push(in_stack_ffffffffffffffb0,(uint *)in_stack_ffffffffffffffa8);
    }
    if (1 < *(int *)(in_RDI + 0xf8)) {
      std::operator<<((ostream *)&std::cerr,"c added clause ");
      this_01 = operator<<((ostream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

inline void OnlineProofChecker::addParsedclause(const vec<Lit> &cls)
{
    if (cls.size() == 0) {
        ok = false;
        return;
    }

    // have enough variables present
    for (int i = 0; i < cls.size(); ++i) {
        while (nVars() <= var(cls[i])) {
            newVar();
        }
    }

    if (cls.size() > 1) {
        CRef ref = ca.alloc(cls, false);
        for (int i = 0; i < cls.size(); ++i) {
            occ[toInt(cls[i])].push_back(ref);
        }
        attachClause(ref);
        clauses.push(ref);
    } else {
        unitClauses.push(cls[0]);
    }

    if (verbose > 1) {
        std::cerr << "c added clause " << cls << std::endl;
    }
    // here, do not check whether the clause is entailed, because its still input!
}